

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O3

void __thiscall Fl_Group::insert(Fl_Group *this,Fl_Widget *o,int index)

{
  uint uVar1;
  Fl_Group *this_00;
  Fl_Widget *pFVar2;
  Fl_Widget ***pppFVar3;
  Fl_Widget **ppFVar4;
  ulong uVar5;
  int iVar6;
  char *__filename;
  
  this_00 = o->parent_;
  if (this_00 != (Fl_Group *)0x0) {
    uVar1 = this_00->children_;
    __filename = (char *)(ulong)uVar1;
    if ((int)uVar1 < 1) {
      __filename = (char *)0x0;
    }
    else {
      if (__filename == &DAT_00000001) {
        pppFVar3 = &this_00->array_;
      }
      else {
        pppFVar3 = (Fl_Widget ***)this_00->array_;
      }
      uVar5 = 0;
      do {
        if ((Fl_Widget *)pppFVar3[uVar5] == o) {
          __filename = (char *)(uVar5 & 0xffffffff);
          break;
        }
        uVar5 = uVar5 + 1;
      } while (uVar1 != (uint)uVar5);
    }
    if ((this_00 == this) &&
       (index = index - (uint)((int)__filename < index), index == (int)__filename)) {
      return;
    }
    remove(this_00,__filename);
  }
  o->parent_ = this;
  uVar1 = this->children_;
  uVar5 = (ulong)(int)uVar1;
  if (uVar5 == 1) {
    pFVar2 = (Fl_Widget *)this->array_;
    ppFVar4 = (Fl_Widget **)malloc(0x10);
    this->array_ = ppFVar4;
    if (index == 0) {
      *ppFVar4 = o;
      ppFVar4[1] = pFVar2;
    }
    else {
      *ppFVar4 = pFVar2;
      ppFVar4[1] = o;
    }
    iVar6 = 2;
  }
  else if (uVar1 == 0) {
    this->array_ = (Fl_Widget **)o;
    iVar6 = 1;
  }
  else {
    if ((uVar1 & uVar1 - 1) == 0) {
      ppFVar4 = (Fl_Widget **)realloc(this->array_,uVar5 << 4);
      this->array_ = ppFVar4;
      uVar5 = (ulong)(uint)this->children_;
    }
    iVar6 = (int)uVar5;
    uVar5 = uVar5 & 0xffffffff;
    if (index < iVar6) {
      uVar5 = (ulong)iVar6;
      do {
        this->array_[uVar5] = this->array_[uVar5 - 1];
        uVar5 = uVar5 - 1;
      } while ((long)index < (long)uVar5);
    }
    this->array_[(int)uVar5] = o;
    iVar6 = iVar6 + 1;
  }
  this->children_ = iVar6;
  if (this->sizes_ != (int *)0x0) {
    operator_delete__(this->sizes_);
  }
  this->sizes_ = (int *)0x0;
  return;
}

Assistant:

void Fl_Group::insert(Fl_Widget &o, int index) {
  if (o.parent()) {
    Fl_Group* g = o.parent();
    int n = g->find(o);
    if (g == this) {
      if (index > n) index--;
      if (index == n) return;
    }
    g->remove(n);
  }
  o.parent_ = this;
  if (children_ == 0) { // use array pointer to point at single child
    array_ = (Fl_Widget**)&o;
  } else if (children_ == 1) { // go from 1 to 2 children
    Fl_Widget* t = (Fl_Widget*)array_;
    array_ = (Fl_Widget**)malloc(2*sizeof(Fl_Widget*));
    if (index) {array_[0] = t; array_[1] = &o;}
    else {array_[0] = &o; array_[1] = t;}
  } else {
    if (!(children_ & (children_-1))) // double number of children
      array_ = (Fl_Widget**)realloc((void*)array_,
				    2*children_*sizeof(Fl_Widget*));
    int j; for (j = children_; j > index; j--) array_[j] = array_[j-1];
    array_[j] = &o;
  }
  children_++;
  init_sizes();
}